

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O1

vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
* __thiscall
anurbs::NurbsCurveGeometry<2L>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,NurbsCurveGeometry<2L> *this,double t,Index order)

{
  pointer pMVar1;
  double dVar2;
  double dVar3;
  pointer pMVar4;
  bool bVar5;
  double *pdVar6;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar7;
  long lVar8;
  long pole;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *derivatives;
  NurbsCurveShapeFunction shape_function;
  undefined1 local_148 [24];
  long lStack_130;
  Matrix<double,__1,_1,_0,__1,_1> local_120;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_108;
  NurbsCurveShapeFunction local_e0;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_58;
  
  local_e0.m_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_e0.m_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_e0.m_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_e0.m_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_e0.m_ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  local_e0.m_ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  local_e0.m_right.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  local_e0.m_ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_e0.m_left.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  local_e0.m_right.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_e0.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 0;
  local_e0.m_left.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_e0.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_e0.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0;
  NurbsCurveShapeFunction::resize(&local_e0,this->m_degree,order);
  lVar8 = (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if (lVar8 < 1) {
    local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_148._16_8_ =
         (this->m_knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data;
    lStack_130 = (this->m_knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
    if (lStack_130 < 0 && (double *)local_148._16_8_ != (double *)0x0) goto LAB_001f21a7;
    NurbsCurveShapeFunction::compute
              (&local_e0,
               (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
               (local_148 + 0x10),t);
    pMVar7 = &local_120;
  }
  else {
    local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    local_108.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_data = (this->m_knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    local_108.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_rows.m_value =
         (this->m_knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    if (local_108.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_rows.m_value < 0 &&
        local_108.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_data != (double *)0x0) {
LAB_001f21a7:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                   );
    }
    local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    local_58.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_data = (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    local_58.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_rows.m_value = lVar8;
    NurbsCurveShapeFunction::compute(&local_e0,&local_108,&local_58,t);
    pMVar7 = &local_108.m_object;
    free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
  }
  free((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::vector(__return_storage_ptr__,local_e0.m_order + 1,(allocator_type *)local_148);
  if (-1 < local_e0.m_order) {
    lVar8 = 0;
    do {
      pMVar1 = (__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar8;
      (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
      [0] = 0;
      *(double *)
       ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
               m_data + 8) = 0.0;
      if (-1 < local_e0.m_degree) {
        pole = 0;
        do {
          NurbsCurveGeometry<2L>::pole((NurbsCurveGeometry<2L> *)local_148,(Index)this);
          pdVar6 = NurbsCurveShapeFunction::value(&local_e0,lVar8,pole);
          dVar2 = *pdVar6;
          pMVar4 = (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar1 = pMVar4 + lVar8;
          dVar3 = *(double *)
                   ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                           m_storage.m_data + 8);
          pMVar4 = pMVar4 + lVar8;
          (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
          array[0] = dVar2 * (double)local_148._0_8_ +
                     (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                     m_storage.m_data.array[0];
          *(double *)
           ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                   m_data + 8) = dVar2 * (double)local_148._8_8_ + dVar3;
          bVar5 = pole < local_e0.m_degree;
          pole = pole + 1;
        } while (bVar5);
      }
      bVar5 = lVar8 < local_e0.m_order;
      lVar8 = lVar8 + 1;
    } while (bVar5);
  }
  free(local_e0.m_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_e0.m_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_e0.m_ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_data);
  free(local_e0.m_right.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_e0.m_left.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_e0.m_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order) const override
    {
        NurbsCurveShapeFunction shape_function;

        shape_function.resize(m_degree, order);

        if (m_weights.size() > 0) {
            shape_function.compute(m_knots, m_weights, t);
        } else {
            shape_function.compute(m_knots, t);
        }

        std::vector<Vector> derivatives(shape_function.nb_shapes());

        for (Index order = 0; order < shape_function.nb_shapes(); order++) {
            derivatives[order] = Vector::Zero();

            for (Index i = 0; i < shape_function.nb_nonzero_poles(); i++) {
                Index index = shape_function.first_nonzero_pole() + i;

                derivatives[order] += pole(index) * shape_function.value(order, i);
            }
        }

        return derivatives;
    }